

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

FxExpression * __thiscall FxPlusSign::Resolve(FxPlusSign *this,FCompileContext *ctx)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  FxExpression *pFVar3;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->Operand != (FxExpression *)0x0) {
    iVar2 = (*this->Operand->_vptr_FxExpression[2])();
    pFVar3 = (FxExpression *)CONCAT44(extraout_var,iVar2);
    this->Operand = pFVar3;
    if (pFVar3 != (FxExpression *)0x0) {
      bVar1 = FxExpression::IsNumeric(pFVar3);
      if (bVar1) {
        pFVar3 = this->Operand;
        this->Operand = (FxExpression *)0x0;
      }
      else {
        pFVar3 = (FxExpression *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Numeric type expected");
      }
      goto LAB_005d069d;
    }
  }
  pFVar3 = (FxExpression *)0x0;
LAB_005d069d:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return pFVar3;
}

Assistant:

FxExpression *FxPlusSign::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(Operand, ctx);

	if (Operand->IsNumeric())
	{
		FxExpression *e = Operand;
		Operand = NULL;
		delete this;
		return e;
	}
	else
	{
		ScriptPosition.Message(MSG_ERROR, "Numeric type expected");
		delete this;
		return NULL;
	}
}